

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_math.c
# Opt level: O1

double acosd(double v)

{
  double dVar1;
  
  if (1.0 <= v) {
    if (v + -1.0 < 1e-10) {
      return 0.0;
    }
  }
  else {
    if ((v == 0.0) && (!NAN(v))) {
      return 90.0;
    }
    if ((v <= -1.0) && (-1e-10 < v + 1.0)) {
      return 180.0;
    }
  }
  dVar1 = acos(v);
  return dVar1 * 57.29577951308232;
}

Assistant:

double acosd(double v) {
    if (v >= 1.0) {
        if (v - 1.0 < TRIG_TOL)
            return 0.0;
    } else if (v == 0.0) {
        return 90.0;
    } else if (v <= -1.0) {
        if (v + 1.0 > -TRIG_TOL)
            return 180.0;
    }

    return acos(v) * R2D;
}